

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# low_level_alloc.cc
# Opt level: O2

void * absl::base_internal::DoAllocWithArena(size_t request,Arena *arena)

{
  AllocList *head;
  AllocList *e;
  ulong uVar1;
  int iVar2;
  uintptr_t uVar3;
  uintptr_t uVar4;
  uintptr_t *puVar5;
  uint *puVar6;
  AllocList *pAVar7;
  ArenaLock section;
  AllocList *prev [30];
  
  if (request == 0) {
    return (void *)0x0;
  }
  anon_unknown_0::ArenaLock::ArenaLock(&section,arena);
  uVar3 = CheckedAdd(request,0x20);
  uVar3 = RoundUp(uVar3,arena->round_up);
  head = &arena->freelist;
  do {
    iVar2 = LLA_SkiplistLevels(uVar3,arena->min_size,(uint32_t *)0x0);
    if (iVar2 <= (arena->freelist).levels) {
      pAVar7 = head;
      while( true ) {
        if (pAVar7->levels < iVar2) {
          raw_logging_internal::RawLog
                    (kFatal,"low_level_alloc.cc",0x1c6,"Check %s failed: %s","i < prev->levels");
        }
        e = pAVar7->next[iVar2 + -1];
        if (e == (AllocList *)0x0) break;
        if (((e->header).magic ^ (ulong)e) != 0xffffffffb37cc16a) {
          raw_logging_internal::RawLog
                    (kFatal,"low_level_alloc.cc",0x1cb,"Check %s failed: %s",
                     "next->header.magic == Magic(kMagicUnallocated, &next->header)");
        }
        if ((e->header).arena != arena) {
          raw_logging_internal::RawLog
                    (kFatal,"low_level_alloc.cc",0x1cc,"Check %s failed: %s",
                     "next->header.arena == arena");
        }
        if (head != pAVar7) {
          if (e <= pAVar7) {
            raw_logging_internal::RawLog
                      (kFatal,"low_level_alloc.cc",0x1ce,"Check %s failed: %s","prev < next");
          }
          if (e <= (AllocList *)((long)pAVar7->next + ((pAVar7->header).size - 0x28))) {
            raw_logging_internal::RawLog
                      (kFatal,"low_level_alloc.cc",0x1d1,"Check %s failed: %s",
                       "reinterpret_cast<char *>(prev) + prev->header.size < reinterpret_cast<char *>(next)"
                      );
          }
        }
        pAVar7 = e;
        if (uVar3 <= (e->header).size) {
          LLA_SkiplistDelete(head,e,prev);
          uVar4 = CheckedAdd(uVar3,arena->min_size);
          uVar1 = (e->header).size;
          if (uVar4 <= uVar1) {
            *(ulong *)((long)e->next + (uVar3 - 0x28)) = uVar1 - uVar3;
            *(uintptr_t *)((long)e->next + (uVar3 - 0x20)) =
                 (long)e->next + (uVar3 - 0x28) ^ 0x4c833e95;
            *(Arena **)((long)e->next + (uVar3 - 0x18)) = arena;
            (e->header).size = uVar3;
            AddToFreelist((void *)((long)e->next + (uVar3 - 8)),arena);
          }
          (e->header).magic = (ulong)e ^ 0x4c833e95;
          if ((e->header).arena != arena) {
            raw_logging_internal::RawLog
                      (kFatal,"low_level_alloc.cc",0x254,"Check %s failed: %s",
                       "s->header.arena == arena","");
          }
          arena->allocation_count = arena->allocation_count + 1;
          anon_unknown_0::ArenaLock::Leave(&section);
          anon_unknown_0::ArenaLock::~ArenaLock(&section);
          return &e->levels;
        }
      }
    }
    SpinLock::Unlock(&arena->mu);
    uVar4 = RoundUp(uVar3,arena->pagesize << 4);
    if ((arena->flags & 2) == 0) {
      puVar5 = (uintptr_t *)mmap((void *)0x0,uVar4,3,0x22,-1,0);
    }
    else {
      puVar5 = (uintptr_t *)DirectMmap((void *)0x0,uVar4,3,0x22,-1,0);
    }
    if (puVar5 == (uintptr_t *)0xffffffffffffffff) {
      puVar6 = (uint *)__errno_location();
      raw_logging_internal::RawLog
                (kFatal,"low_level_alloc.cc",0x23a,"mmap error: %d",(ulong)*puVar6);
    }
    SpinLock::Lock(&arena->mu);
    *puVar5 = uVar4;
    puVar5[1] = (ulong)puVar5 ^ 0x4c833e95;
    puVar5[2] = (uintptr_t)arena;
    AddToFreelist(puVar5 + 4,arena);
  } while( true );
}

Assistant:

static void *DoAllocWithArena(size_t request, LowLevelAlloc::Arena *arena) {
  void *result = nullptr;
  if (request != 0) {
    AllocList *s;       // will point to region that satisfies request
    ArenaLock section(arena);
    // round up with header
    size_t req_rnd = RoundUp(CheckedAdd(request, sizeof (s->header)),
                             arena->round_up);
    for (;;) {      // loop until we find a suitable region
      // find the minimum levels that a block of this size must have
      int i = LLA_SkiplistLevels(req_rnd, arena->min_size, nullptr) - 1;
      if (i < arena->freelist.levels) {   // potential blocks exist
        AllocList *before = &arena->freelist;  // predecessor of s
        while ((s = Next(i, before, arena)) != nullptr &&
               s->header.size < req_rnd) {
          before = s;
        }
        if (s != nullptr) {       // we found a region
          break;
        }
      }
      // we unlock before mmap() both because mmap() may call a callback hook,
      // and because it may be slow.
      arena->mu.Unlock();
      // mmap generous 64K chunks to decrease
      // the chances/impact of fragmentation:
      size_t new_pages_size = RoundUp(req_rnd, arena->pagesize * 16);
      void *new_pages;
#ifdef _WIN32
      new_pages = VirtualAlloc(0, new_pages_size,
                               MEM_RESERVE | MEM_COMMIT, PAGE_READWRITE);
      ABSL_RAW_CHECK(new_pages != nullptr, "VirtualAlloc failed");
#else
#ifndef ABSL_LOW_LEVEL_ALLOC_ASYNC_SIGNAL_SAFE_MISSING
      if ((arena->flags & LowLevelAlloc::kAsyncSignalSafe) != 0) {
        new_pages = base_internal::DirectMmap(nullptr, new_pages_size,
            PROT_WRITE|PROT_READ, MAP_ANONYMOUS|MAP_PRIVATE, -1, 0);
      } else {
        new_pages = mmap(nullptr, new_pages_size, PROT_WRITE | PROT_READ,
                         MAP_ANONYMOUS | MAP_PRIVATE, -1, 0);
      }
#else
      new_pages = mmap(nullptr, new_pages_size, PROT_WRITE | PROT_READ,
                       MAP_ANONYMOUS | MAP_PRIVATE, -1, 0);
#endif  // ABSL_LOW_LEVEL_ALLOC_ASYNC_SIGNAL_SAFE_MISSING
      if (new_pages == MAP_FAILED) {
        ABSL_RAW_LOG(FATAL, "mmap error: %d", errno);
      }

#endif  // _WIN32
      arena->mu.Lock();
      s = reinterpret_cast<AllocList *>(new_pages);
      s->header.size = new_pages_size;
      // Pretend the block is allocated; call AddToFreelist() to free it.
      s->header.magic = Magic(kMagicAllocated, &s->header);
      s->header.arena = arena;
      AddToFreelist(&s->levels, arena);  // insert new region into free list
    }
    AllocList *prev[kMaxLevel];
    LLA_SkiplistDelete(&arena->freelist, s, prev);    // remove from free list
    // s points to the first free region that's big enough
    if (CheckedAdd(req_rnd, arena->min_size) <= s->header.size) {
      // big enough to split
      AllocList *n = reinterpret_cast<AllocList *>
                        (req_rnd + reinterpret_cast<char *>(s));
      n->header.size = s->header.size - req_rnd;
      n->header.magic = Magic(kMagicAllocated, &n->header);
      n->header.arena = arena;
      s->header.size = req_rnd;
      AddToFreelist(&n->levels, arena);
    }
    s->header.magic = Magic(kMagicAllocated, &s->header);
    ABSL_RAW_CHECK(s->header.arena == arena, "");
    arena->allocation_count++;
    section.Leave();
    result = &s->levels;
  }
  ABSL_ANNOTATE_MEMORY_IS_UNINITIALIZED(result, request);
  return result;
}